

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_search.cc
# Opt level: O2

void run(vw *vw_obj)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  vector<wt,_std::allocator<wt>_> data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> output;
  SequenceLabelerTask task;
  allocator local_161;
  wt local_160;
  vector<wt,_std::allocator<wt>_> local_138;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_100;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  SequenceLabelerTask::SequenceLabelerTask((SequenceLabelerTask *)&local_100,vw_obj);
  local_138.super__Vector_base<wt,_std::allocator<wt>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_138.super__Vector_base<wt,_std::allocator<wt>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_138.super__Vector_base<wt,_std::allocator<wt>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string(local_38,"the",&local_161);
  std::__cxx11::string::string((string *)&local_160,local_38);
  local_160.tag = 1;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::string(local_58,"monster",&local_161);
  std::__cxx11::string::string((string *)&local_160,local_58);
  local_160.tag = 2;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::string(local_78,"ate",&local_161);
  std::__cxx11::string::string((string *)&local_160,local_78);
  local_160.tag = 3;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::string(local_98,"a",&local_161);
  std::__cxx11::string::string((string *)&local_160,local_98);
  local_160.tag = 1;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::string(local_b8,"big",&local_161);
  std::__cxx11::string::string((string *)&local_160,local_b8);
  local_160.tag = 4;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::string(local_d8,"sandwich",&local_161);
  std::__cxx11::string::string((string *)&local_160,local_d8);
  local_160.tag = 2;
  std::vector<wt,_std::allocator<wt>_>::emplace_back<wt>(&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string(local_d8);
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::learn(&local_100,&local_138,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_118);
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::learn(&local_100,&local_138,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_118);
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::learn(&local_100,&local_138,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_118);
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::predict(&local_100,&local_138,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_118)
  ;
  std::operator<<((ostream *)&std::cerr,"output = [");
  for (uVar2 = 0;
      uVar2 < (ulong)((long)local_118._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_118._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cerr," ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr," ]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"should have printed: 1 2 3 1 4 2");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_118);
  std::vector<wt,_std::allocator<wt>_>::~vector(&local_138);
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::~SearchTask(&local_100);
  return;
}

Assistant:

void run(vw& vw_obj)
{ // we put this in its own scope so that its destructor on
  // SequenceLabelerTask gets called *before* VW::finish gets called;
  // otherwise we'll get a segfault :(. i'm not sure what to do about
  // this :(.
  SequenceLabelerTask task(vw_obj);
  vector<wt> data;
  vector<uint32_t> output;
  uint32_t DET = 1, NOUN = 2, VERB = 3, ADJ = 4;
  data.push_back( wt("the", DET) );
  data.push_back( wt("monster", NOUN) );
  data.push_back( wt("ate", VERB) );
  data.push_back( wt("a", DET) );
  data.push_back( wt("big", ADJ) );
  data.push_back( wt("sandwich", NOUN) );
  task.learn(data, output);
  task.learn(data, output);
  task.learn(data, output);
  task.predict(data, output);
  cerr << "output = [";
  for (size_t i=0; i<output.size(); i++) cerr << " " << output[i];
  cerr << " ]" << endl;
  cerr << "should have printed: 1 2 3 1 4 2" << endl;
}